

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O1

bool __thiscall
FOptionMenuScreenResolutionLine::MenuEvent
          (FOptionMenuScreenResolutionLine *this,int mkey,bool fromcontroller)

{
  bool bVar1;
  int iVar2;
  FSoundID *sound_id;
  FSoundID FStack_8;
  FSoundID local_4;
  
  sound_id = &FStack_8;
  if (mkey == 3) {
    iVar2 = 0;
    if (this->mSelection < this->mMaxValid) {
      iVar2 = this->mSelection + 1;
    }
    this->mSelection = iVar2;
    iVar2 = S_FindSound("menu/cursor");
  }
  else {
    if (mkey != 2) {
      bVar1 = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
      return bVar1;
    }
    iVar2 = this->mSelection;
    this->mSelection = iVar2 + -1;
    if (iVar2 < 1) {
      this->mSelection = this->mMaxValid;
    }
    iVar2 = S_FindSound("menu/cursor");
    sound_id = &local_4;
  }
  sound_id->ID = iVar2;
  S_Sound(0x22,sound_id,snd_menuvolume.Value,0.0);
  return true;
}

Assistant:

bool MenuEvent (int mkey, bool fromcontroller)
	{
		if (mkey == MKEY_Left)
		{
			if (--mSelection < 0) mSelection = mMaxValid;
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			return true;
		}
		else if (mkey == MKEY_Right)
		{
			if (++mSelection > mMaxValid) mSelection = 0;
			S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			return true;
		}
		else 
		{
			return FOptionMenuItem::MenuEvent(mkey, fromcontroller);
		}
		return false;
	}